

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManPrintLutStats(Gia_Man_t *p)

{
  uint nSizeMax_00;
  int iVar1;
  int local_a8 [2];
  int pCounts [33];
  int local_14;
  int nSizeMax;
  int i;
  Gia_Man_t *p_local;
  
  memset(local_a8,0,0x84);
  nSizeMax_00 = Gia_ManLutSizeMax(p);
  if ((int)nSizeMax_00 < 0x21) {
    for (local_14 = 1; iVar1 = Gia_ManObjNum(p), local_14 < iVar1; local_14 = local_14 + 1) {
      iVar1 = Gia_ObjIsLut(p,local_14);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjLutSize(p,local_14);
        pCounts[(long)iVar1 + -2] = pCounts[(long)iVar1 + -2] + 1;
      }
    }
    Gia_ManPrintNodeProfile(local_a8,nSizeMax_00);
  }
  else {
    Abc_Print(1,"The max LUT size (%d) is too large.\n",(ulong)nSizeMax_00);
  }
  return;
}

Assistant:

void Gia_ManPrintLutStats( Gia_Man_t * p )
{
    int i, nSizeMax, pCounts[33] = {0};
    nSizeMax = Gia_ManLutSizeMax( p );
    if ( nSizeMax > 32 )
    {
        Abc_Print( 1, "The max LUT size (%d) is too large.\n", nSizeMax );
        return;
    }
    Gia_ManForEachLut( p, i )
        pCounts[ Gia_ObjLutSize(p, i) ]++;
    Gia_ManPrintNodeProfile( pCounts, nSizeMax );
}